

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::Parser::ParseImport
          (Parser *this,
          RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *dependency,RepeatedField<int> *public_dependency,RepeatedField<int> *weak_dependency,
          LocationRecorder *root_location,FileDescriptorProto *containing_file)

{
  ArenaImpl *this_00;
  bool bVar1;
  int iVar2;
  Rep *pRVar3;
  string *psVar4;
  int iVar5;
  string *psVar6;
  string import_file;
  LocationRecorder weak_location;
  LocationRecorder location;
  string local_80;
  undefined1 local_60 [40];
  long local_38;
  
  LocationRecorder::LocationRecorder
            ((LocationRecorder *)(local_60 + 0x18),root_location,3,
             (dependency->super_RepeatedPtrFieldBase).current_size_);
  bVar1 = Consume(this,"import");
  if (!bVar1) {
LAB_003112a9:
    bVar1 = false;
    goto LAB_00311381;
  }
  iVar2 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
  if (iVar2 == 0) {
    LocationRecorder::LocationRecorder
              ((LocationRecorder *)&local_80,root_location,10,public_dependency->current_size_);
    bVar1 = Consume(this,"public");
    if (!bVar1) {
      psVar6 = &local_80;
LAB_003112a4:
      LocationRecorder::~LocationRecorder((LocationRecorder *)psVar6);
      goto LAB_003112a9;
    }
    iVar2 = (dependency->super_RepeatedPtrFieldBase).current_size_;
    iVar5 = public_dependency->current_size_;
    if (iVar5 == public_dependency->total_size_) {
      RepeatedField<int>::Reserve(public_dependency,iVar5 + 1);
      iVar5 = public_dependency->current_size_;
    }
    public_dependency->current_size_ = iVar5 + 1;
    *(int *)((long)public_dependency->arena_or_elements_ + (long)iVar5 * 4) = iVar2;
    psVar6 = &local_80;
LAB_00311234:
    LocationRecorder::~LocationRecorder((LocationRecorder *)psVar6);
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
    if (iVar2 == 0) {
      LocationRecorder::LocationRecorder
                ((LocationRecorder *)local_60,root_location,0xb,weak_dependency->current_size_);
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"weak","");
      if (*(SourceLocationTable **)(local_60._0_8_ + 0x18) != (SourceLocationTable *)0x0) {
        SourceLocationTable::AddImport
                  (*(SourceLocationTable **)(local_60._0_8_ + 0x18),&containing_file->super_Message,
                   &local_80,**(int **)(local_60._16_8_ + 0x38),
                   (*(int **)(local_60._16_8_ + 0x38))[1]);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p);
      }
      bVar1 = Consume(this,"weak");
      if (!bVar1) {
        psVar6 = (string *)local_60;
        goto LAB_003112a4;
      }
      iVar2 = (dependency->super_RepeatedPtrFieldBase).current_size_;
      iVar5 = weak_dependency->current_size_;
      if (iVar5 == weak_dependency->total_size_) {
        RepeatedField<int>::Reserve(weak_dependency,iVar5 + 1);
        iVar5 = weak_dependency->current_size_;
      }
      weak_dependency->current_size_ = iVar5 + 1;
      *(int *)((long)weak_dependency->arena_or_elements_ + (long)iVar5 * 4) = iVar2;
      psVar6 = (string *)local_60;
      goto LAB_00311234;
    }
  }
  local_80._M_string_length = 0;
  local_80.field_2._M_local_buf[0] = '\0';
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  bVar1 = ConsumeString(this,&local_80,"Expected a string naming the file to import.");
  if (bVar1) {
    pRVar3 = (dependency->super_RepeatedPtrFieldBase).rep_;
    if (pRVar3 == (Rep *)0x0) {
      iVar2 = (dependency->super_RepeatedPtrFieldBase).total_size_;
LAB_003112b6:
      internal::RepeatedPtrFieldBase::Reserve(&dependency->super_RepeatedPtrFieldBase,iVar2 + 1);
      pRVar3 = (dependency->super_RepeatedPtrFieldBase).rep_;
      iVar2 = pRVar3->allocated_size;
LAB_003112c6:
      pRVar3->allocated_size = iVar2 + 1;
      this_00 = (ArenaImpl *)(dependency->super_RepeatedPtrFieldBase).arena_;
      if (this_00 == (ArenaImpl *)0x0) {
        psVar4 = (string *)operator_new(0x20);
      }
      else {
        if (this_00[1].initial_block_ != (Block *)0x0) {
          Arena::OnArenaAllocation
                    ((Arena *)this_00,(type_info *)&std::__cxx11::string::typeinfo,0x20);
        }
        psVar4 = (string *)
                 internal::ArenaImpl::AllocateAlignedAndAddCleanup
                           (this_00,0x20,internal::arena_destruct_object<std::__cxx11::string>);
      }
      *(string **)psVar4 = psVar4 + 0x10;
      *(long *)(psVar4 + 8) = 0;
      psVar4[0x10] = (string)0x0;
      iVar2 = (dependency->super_RepeatedPtrFieldBase).current_size_;
      (dependency->super_RepeatedPtrFieldBase).current_size_ = iVar2 + 1;
      ((dependency->super_RepeatedPtrFieldBase).rep_)->elements[iVar2] = psVar4;
    }
    else {
      iVar5 = (dependency->super_RepeatedPtrFieldBase).current_size_;
      iVar2 = pRVar3->allocated_size;
      if (iVar2 <= iVar5) {
        if (iVar2 == (dependency->super_RepeatedPtrFieldBase).total_size_) goto LAB_003112b6;
        goto LAB_003112c6;
      }
      (dependency->super_RepeatedPtrFieldBase).current_size_ = iVar5 + 1;
      psVar4 = (string *)pRVar3->elements[iVar5];
    }
    std::__cxx11::string::_M_assign(psVar4);
    if (*(SourceLocationTable **)(local_60._24_8_ + 0x18) != (SourceLocationTable *)0x0) {
      SourceLocationTable::AddImport
                (*(SourceLocationTable **)(local_60._24_8_ + 0x18),&containing_file->super_Message,
                 &local_80,**(int **)(local_38 + 0x38),(*(int **)(local_38 + 0x38))[1]);
    }
    bVar1 = ConsumeEndOfDeclaration(this,";",(LocationRecorder *)(local_60 + 0x18));
  }
  else {
    bVar1 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
LAB_00311381:
  LocationRecorder::~LocationRecorder((LocationRecorder *)(local_60 + 0x18));
  return bVar1;
}

Assistant:

bool Parser::ParseImport(RepeatedPtrField<std::string>* dependency,
                         RepeatedField<int32>* public_dependency,
                         RepeatedField<int32>* weak_dependency,
                         const LocationRecorder& root_location,
                         const FileDescriptorProto* containing_file) {
  LocationRecorder location(root_location,
                            FileDescriptorProto::kDependencyFieldNumber,
                            dependency->size());

  DO(Consume("import"));

  if (LookingAt("public")) {
    LocationRecorder public_location(
        root_location, FileDescriptorProto::kPublicDependencyFieldNumber,
        public_dependency->size());
    DO(Consume("public"));
    *public_dependency->Add() = dependency->size();
  } else if (LookingAt("weak")) {
    LocationRecorder weak_location(
        root_location, FileDescriptorProto::kWeakDependencyFieldNumber,
        weak_dependency->size());
    weak_location.RecordLegacyImportLocation(containing_file, "weak");
    DO(Consume("weak"));
    *weak_dependency->Add() = dependency->size();
  }

  string import_file;
  DO(ConsumeString(&import_file,
                   "Expected a string naming the file to import."));
  *dependency->Add() = import_file;
  location.RecordLegacyImportLocation(containing_file, import_file);

  DO(ConsumeEndOfDeclaration(";", &location));

  return true;
}